

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void rw::cameraSync(ObjectWithFrame *obj)

{
  Frame *this;
  Matrix *src;
  float fVar1;
  float32 yscl;
  float32 xscl;
  Matrix proj;
  Matrix inv;
  Camera *cam;
  ObjectWithFrame *obj_local;
  
  this = Camera::getFrame((Camera *)obj);
  src = Frame::getLTM(this);
  Matrix::invertOrthonormal((Matrix *)&proj.pos.z,src);
  proj.pos.z = (float32)-(float)proj.pos.z;
  yscl = (float32)(1.0 / (*(float *)&obj[1].inFrame.next * 2.0));
  fVar1 = 1.0 / (*(float *)((long)&obj[1].inFrame.next + 4) * 2.0);
  proj.right.y = 0.0;
  xscl = 0.0;
  proj.right.x = 0.0;
  proj.right.z = 0.0;
  proj.flags = (uint32)-fVar1;
  proj.up.x = 0.0;
  if (*(int *)&obj[2].object.field_0x4 == 1) {
    proj.at.z = (float32)(-*(float *)&obj[1].inFrame.prev * (float)yscl);
    proj.pad2 = (uint32)(*(float *)((long)&obj[1].inFrame.prev + 4) * fVar1);
    proj.pos.x = 0.0;
    proj.up.z = (float32)(-(float)proj.at.z + 0.5);
    proj.pad1 = (uint32)(-(float)proj.pad2 + 0.5);
    proj.at.x = 1.0;
    Matrix::optimize((Matrix *)&yscl,(Tolerance *)0x0);
    Matrix::mult((Matrix *)&obj[2].object.parent,(Matrix *)&proj.pos.z,(Matrix *)&yscl);
    buildClipPersp((Camera *)obj);
  }
  else {
    proj.up.z = (float32)(*(float *)&obj[1].inFrame.prev * (float)yscl);
    proj.pad1 = (uint32)(-*(float *)((long)&obj[1].inFrame.prev + 4) * fVar1);
    proj.at.x = 1.0;
    proj.at.z = (float32)(-(float)proj.up.z + 0.5);
    proj.pad2 = (uint32)(-(float)proj.pad1 + 0.5);
    proj.pos.x = 0.0;
    Matrix::optimize((Matrix *)&yscl,(Tolerance *)0x0);
    Matrix::mult((Matrix *)&obj[2].object.parent,(Matrix *)&proj.pos.z,(Matrix *)&yscl);
    buildClipParallel((Camera *)obj);
  }
  BBox::calculate((BBox *)&obj[9].inFrame,(V3d *)(obj + 7),8);
  return;
}

Assistant:

static void
cameraSync(ObjectWithFrame *obj)
{
	/*
	 * RW projection matrix looks like this:
	 *       (cf. Camera View Matrix white paper)
	 * w = viewWindow width
	 * h = viewWindow height
	 * o = view offset
	 *
	 * perspective:
	 * 1/2w       0    ox/2w + 1/2   -ox/2w
	 *    0   -1/2h   -oy/2h + 1/2    oy/2h
	 *    0       0              1        0
	 *    0       0              1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w + 1/2
	 *    0   -1/2h   -oy/2h    oy/2h + 1/2
	 *    0       0        1              0
	 *    0       0        0              1
	 *
	 * The view matrix transforms from world to clip space, it is however
	 * not used for OpenGL or D3D since transformation to camera space
	 * and to clip space are handled by separate matrices there.
	 * On these platforms the two matrices are built in the platform's
	 * beginUpdate function.
	 * On the PS2 the z- and w-rows are the same and the 
	 * 1/2 translation/shear is removed again on the VU1 by
	 * subtracting the w-row/2 from the x- and y-rows.
	 *
	 * perspective:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        1        0
	 *
	 * parallel:
	 * 1/2w       0    ox/2w   -ox/2w
	 *    0   -1/2h   -oy/2h    oy/2h
	 *    0       0        1        0
	 *    0       0        0        1
	 *
	 * RW builds this matrix directly without using explicit
	 * inversion and matrix multiplication.
	 */

	Camera *cam = (Camera*)obj;
	Matrix inv, proj;
	Matrix::invertOrthonormal(&inv, cam->getFrame()->getLTM());

	inv.right.x = -inv.right.x;
	inv.up.x = -inv.up.x;
	inv.at.x = -inv.at.x;
	inv.pos.x = -inv.pos.x;

	float32 xscl = 1.0f/(2.0f*cam->viewWindow.x);
	float32 yscl = 1.0f/(2.0f*cam->viewWindow.y);

	proj.flags = 0;
	proj.right.x = xscl;
	proj.right.y = 0.0f;
	proj.right.z = 0.0f;

	proj.up.x = 0.0f;
	proj.up.y = -yscl;
	proj.up.z = 0.0f;

	if(cam->projection == Camera::PERSPECTIVE){
		proj.pos.x = -cam->viewOffset.x*xscl;
		proj.pos.y = cam->viewOffset.y*yscl;
		proj.pos.z = 0.0f;

		proj.at.x = -proj.pos.x + 0.5f;
		proj.at.y = -proj.pos.y + 0.5f;
		proj.at.z = 1.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipPersp(cam);
	}else{
		proj.at.x = cam->viewOffset.x*xscl;
		proj.at.y = -cam->viewOffset.y*yscl;
		proj.at.z = 1.0f;

		proj.pos.x = -proj.at.x + 0.5f;
		proj.pos.y = -proj.at.y + 0.5f;
		proj.pos.z = 0.0f;
		proj.optimize();
		Matrix::mult(&cam->viewMatrix, &inv, &proj);
		buildClipParallel(cam);
	}
	cam->frustumBoundBox.calculate(cam->frustumCorners, 8);
}